

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiStoragePair * LowerBound(ImVector<ImGuiStorage::ImGuiStoragePair> *data,ImGuiID key)

{
  ImGuiStoragePair *pIVar1;
  ulong uVar2;
  ulong uVar3;
  
  pIVar1 = data->Data;
  uVar3 = (long)data->Size;
  while (uVar2 = uVar3, uVar2 != 0) {
    uVar3 = uVar2 >> 1;
    if (pIVar1[uVar3].key < key) {
      pIVar1 = pIVar1 + uVar3 + 1;
      uVar3 = ~uVar3 + uVar2;
    }
  }
  return pIVar1;
}

Assistant:

static ImGuiStorage::ImGuiStoragePair* LowerBound(ImVector<ImGuiStorage::ImGuiStoragePair>& data, ImGuiID key)
{
    ImGuiStorage::ImGuiStoragePair* first = data.Data;
    ImGuiStorage::ImGuiStoragePair* last = data.Data + data.Size;
    size_t count = (size_t)(last - first);
    while (count > 0)
    {
        size_t count2 = count >> 1;
        ImGuiStorage::ImGuiStoragePair* mid = first + count2;
        if (mid->key < key)
        {
            first = ++mid;
            count -= count2 + 1;
        }
        else
        {
            count = count2;
        }
    }
    return first;
}